

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::GetNodeWithValidCharacterSet
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,EncodedChar cc)

{
  code *pcVar1;
  bool bVar2;
  ScriptConfiguration *this_00;
  ConcatNode *pCVar3;
  ConcatNode *this_01;
  MatchSetNode *this_02;
  AltNode *this_03;
  AltNode *this_04;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  MatchSetNode *pMVar5;
  undefined4 *puVar6;
  TrackAllocData local_278;
  MatchSetNode *local_250;
  MatchSetNode *setNode;
  undefined8 local_240;
  TrackAllocData local_238;
  code *local_210;
  undefined8 local_208;
  TrackAllocData local_200;
  code *local_1d8;
  undefined8 local_1d0;
  TrackAllocData local_1c8;
  AltNode *altNode;
  undefined8 local_190;
  TrackAllocData local_188;
  MatchSetNode *local_160;
  MatchSetNode *partialSuffixSetNode;
  undefined8 local_150;
  TrackAllocData local_148;
  MatchSetNode *local_120;
  MatchSetNode *partialPrefixSetNode;
  undefined8 local_110;
  TrackAllocData local_108;
  code *local_e0;
  undefined8 local_d8;
  TrackAllocData local_d0;
  ConcatNode *local_a8;
  ConcatNode *surrogateRangePairNode;
  undefined8 local_98;
  TrackAllocData local_90;
  MatchSetNode *local_68;
  MatchSetNode *upperRangeNode;
  undefined8 local_58;
  TrackAllocData local_50;
  MatchSetNode *local_28;
  MatchSetNode *lowerRangeNode;
  Node *nodeToReturn;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *pPStack_10;
  EncodedChar cc_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  lowerRangeNode = (MatchSetNode *)0x0;
  nodeToReturn._6_2_ = cc;
  pPStack_10 = this;
  this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
  bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
  if ((bVar2) && ((this->unicodeFlagPresent & 1U) != 0)) {
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc1a);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_50);
    upperRangeNode = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
    local_58 = 0;
    pMVar5 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
    MatchSetNode::MatchSetNode(pMVar5,false,false);
    local_28 = pMVar5;
    CharSet<char16_t>::SetRange(&pMVar5->set,this->ctAllocator,L'\xd800',L'\xdbff');
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_90,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc1c);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_90);
    surrogateRangePairNode = (ConcatNode *)Memory::ArenaAllocator::Alloc;
    local_98 = 0;
    pMVar5 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
    MatchSetNode::MatchSetNode(pMVar5,false,false);
    local_68 = pMVar5;
    CharSet<char16_t>::SetRange(&pMVar5->set,this->ctAllocator,L'\xdc00',L'\xdfff');
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d0,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc1f);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_d0);
    local_e0 = Memory::ArenaAllocator::Alloc;
    local_d8 = 0;
    pCVar3 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
    pMVar5 = local_28;
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_108,(type_info *)&ConcatNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc1f);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_108);
    partialPrefixSetNode = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
    local_110 = 0;
    this_01 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar4,0x3f67b0);
    ConcatNode::ConcatNode(this_01,&local_68->super_Node,(ConcatNode *)0x0);
    ConcatNode::ConcatNode(pCVar3,&pMVar5->super_Node,this_01);
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    local_a8 = pCVar3;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_148,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc23);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_148);
    partialSuffixSetNode = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
    local_150 = 0;
    pMVar5 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
    MatchSetNode::MatchSetNode(pMVar5,false,false);
    local_120 = pMVar5;
    if (nodeToReturn._6_2_ == L'.') {
      if ((this->dotAllFlagPresent & 1U) == 0) {
        StandardChars<char16_t>::SetNonNewline(this->standardChars,this->ctAllocator,&pMVar5->set);
      }
      else {
        StandardChars<char16_t>::SetFullSet(this->standardChars,this->ctAllocator,&pMVar5->set);
      }
    }
    else if (nodeToReturn._6_2_ == L'D') {
      StandardChars<char16_t>::SetNonDigits(this->standardChars,this->ctAllocator,&pMVar5->set);
    }
    else if (nodeToReturn._6_2_ == L'S') {
      StandardChars<char16_t>::SetNonWhitespace(this->standardChars,this->ctAllocator,&pMVar5->set);
    }
    else if (nodeToReturn._6_2_ == L'W') {
      if ((this->caseInsensitiveFlagPresent & 1U) == 0) {
        StandardChars<char16_t>::SetNonWordChars(this->standardChars,this->ctAllocator,&pMVar5->set)
        ;
      }
      else {
        StandardChars<char16_t>::SetNonWordIUChars
                  (this->standardChars,this->ctAllocator,&pMVar5->set);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc41,"(false)","");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    CharSet<char16_t>::SubtractRange(&local_120->set,this->ctAllocator,L'\xd800',L'\xdbff');
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_188,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc46);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_188);
    altNode = (AltNode *)Memory::ArenaAllocator::Alloc;
    local_190 = 0;
    pMVar5 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
    MatchSetNode::MatchSetNode(pMVar5,false,false);
    local_160 = pMVar5;
    CharSet<char16_t>::SetRange(&pMVar5->set,this->ctAllocator,L'\xd800',L'\xdbff');
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_1c8,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc49);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_1c8);
    local_1d8 = Memory::ArenaAllocator::Alloc;
    local_1d0 = 0;
    this_02 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
    pMVar5 = local_120;
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_200,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc49);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_200);
    local_210 = Memory::ArenaAllocator::Alloc;
    local_208 = 0;
    this_03 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
    pCVar3 = local_a8;
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_238,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc49);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_238);
    setNode = (MatchSetNode *)Memory::ArenaAllocator::Alloc;
    local_240 = 0;
    this_04 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar4,0x3f67b0);
    AltNode::AltNode(this_04,&local_160->super_Node,(AltNode *)0x0);
    AltNode::AltNode(this_03,&pCVar3->super_Node,this_04);
    AltNode::AltNode((AltNode *)this_02,&pMVar5->super_Node,this_03);
    lowerRangeNode = this_02;
  }
  else {
    pAVar4 = &this->ctAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_278,(type_info *)&MatchSetNode::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
               ,0xc4e);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_278);
    pMVar5 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,(ArenaAllocator *)pAVar4,0x3f67b0);
    MatchSetNode::MatchSetNode(pMVar5,false,false);
    local_250 = pMVar5;
    if (nodeToReturn._6_2_ == L'.') {
      if ((this->dotAllFlagPresent & 1U) == 0) {
        StandardChars<char16_t>::SetNonNewline(this->standardChars,this->ctAllocator,&pMVar5->set);
      }
      else {
        StandardChars<char16_t>::SetFullSet(this->standardChars,this->ctAllocator,&pMVar5->set);
      }
    }
    else if (nodeToReturn._6_2_ == L'D') {
      StandardChars<char16_t>::SetNonDigits(this->standardChars,this->ctAllocator,&pMVar5->set);
    }
    else if (nodeToReturn._6_2_ == L'S') {
      StandardChars<char16_t>::SetNonWhitespace(this->standardChars,this->ctAllocator,&pMVar5->set);
    }
    else if (nodeToReturn._6_2_ == L'W') {
      StandardChars<char16_t>::SetNonWordChars(this->standardChars,this->ctAllocator,&pMVar5->set);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc65,"(false)","");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    lowerRangeNode = local_250;
  }
  return &lowerRangeNode->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::GetNodeWithValidCharacterSet(EncodedChar cc)
    {
        Node* nodeToReturn = nullptr;
        if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && this->unicodeFlagPresent)
        {
            MatchSetNode *lowerRangeNode = Anew(ctAllocator, MatchSetNode, false, false);
            lowerRangeNode->set.SetRange(ctAllocator, (Char)0xD800, (Char)0xDBFF);
            MatchSetNode *upperRangeNode = Anew(ctAllocator, MatchSetNode, false, false);
            upperRangeNode->set.SetRange(ctAllocator, (Char)0xDC00, (Char)0xDFFF);

            ConcatNode* surrogateRangePairNode = Anew(ctAllocator, ConcatNode, lowerRangeNode, Anew(ctAllocator, ConcatNode, upperRangeNode, nullptr));

            // The MatchSet node will be split into [0-D7FFDC00-FFFF] (minus special characters like newline, whitespace, etc.) as a prefix, and a suffix of [D800-DBFF]
            // i.e. The MatchSet node can be with [0-D7FFDC00-FFFF] (minus special characters like newline, whitespace, etc.) OR [D800-DBFF]
            MatchSetNode* partialPrefixSetNode = Anew(ctAllocator, MatchSetNode, false, false);
            switch (cc)
            {
            case '.':
                if (this->dotAllFlagPresent)
                {
                    standardChars->SetFullSet(ctAllocator, partialPrefixSetNode->set);
                }
                else
                {
                    standardChars->SetNonNewline(ctAllocator, partialPrefixSetNode->set);
                }
                break;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, partialPrefixSetNode->set);
                break;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, partialPrefixSetNode->set);
                break;
            case 'W':
                if (this->caseInsensitiveFlagPresent)
                {
                    standardChars->SetNonWordIUChars(ctAllocator, partialPrefixSetNode->set);
                }
                else
                {
                    standardChars->SetNonWordChars(ctAllocator, partialPrefixSetNode->set);
                }
                break;
            default:
                AssertMsg(false, "");
            }

            partialPrefixSetNode->set.SubtractRange(ctAllocator, (Char)0xD800u, (Char)0xDBFFu);

            MatchSetNode* partialSuffixSetNode = Anew(ctAllocator, MatchSetNode, false, false);
            partialSuffixSetNode->set.SetRange(ctAllocator, (Char)0xD800u, (Char)0xDBFFu);

            AltNode* altNode = Anew(ctAllocator, AltNode, partialPrefixSetNode, Anew(ctAllocator, AltNode, surrogateRangePairNode, Anew(ctAllocator, AltNode, partialSuffixSetNode, nullptr)));
            nodeToReturn = altNode;
        }
        else
        {
            MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
            switch (cc)
            {
            case '.':
                if (this->dotAllFlagPresent)
                {
                    standardChars->SetFullSet(ctAllocator, setNode->set);
                }
                else
                {
                    standardChars->SetNonNewline(ctAllocator, setNode->set);
                }
                break;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, setNode->set);
                break;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, setNode->set);
                break;
            case 'W':
                standardChars->SetNonWordChars(ctAllocator, setNode->set);
                break;
            default:
                AssertMsg(false, "");
            }
            nodeToReturn = setNode;
        }

        return nodeToReturn;
    }